

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

bool __thiscall
google::protobuf::DescriptorBuilder::AddSymbol
          (DescriptorBuilder *this,string *full_name,void *parent,string *name,Message *proto,
          Symbol symbol)

{
  Message *pMVar1;
  void *pvVar2;
  bool bVar3;
  LogMessage *pLVar4;
  string *__rhs;
  Symbol SVar5;
  Symbol symbol_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_240;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_220;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_200;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_180;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  long local_c0;
  size_type dot_pos;
  anon_union_8_8_13f84498_for_Symbol_2 local_b0;
  FileDescriptor *local_a8;
  FileDescriptor *other_file;
  LogMessage local_90;
  Symbol local_58;
  Symbol local_48;
  Message *local_38;
  Message *proto_local;
  string *name_local;
  void *parent_local;
  string *full_name_local;
  DescriptorBuilder *this_local;
  
  SVar5 = symbol;
  name_local = (string *)parent;
  if (parent == (void *)0x0) {
    name_local = (string *)this->file_;
  }
  local_48.type = symbol.type;
  local_48._4_4_ = symbol._4_4_;
  symbol.field_1 = SVar5.field_1;
  local_48.field_1 = symbol.field_1;
  SVar5._0_8_ = symbol._0_8_ & 0xffffffff;
  SVar5.field_1.descriptor = symbol.field_1.descriptor;
  local_38 = proto;
  proto_local = (Message *)name;
  parent_local = full_name;
  full_name_local = (string *)this;
  bVar3 = DescriptorPool::Tables::AddSymbol(this->tables_,full_name,SVar5);
  if (bVar3) {
    local_58.type = symbol.type;
    local_58._4_4_ = symbol._4_4_;
    local_58.field_1 = symbol.field_1;
    symbol_00._0_8_ = symbol._0_8_ & 0xffffffff;
    symbol_00.field_1.descriptor = symbol.field_1.descriptor;
    bVar3 = FileDescriptorTables::AddAliasUnderParent
                      (this->file_tables_,name_local,(string *)proto_local,symbol_00);
    if (bVar3) {
      this_local._7_1_ = true;
    }
    else {
      if ((this->had_errors_ & 1U) == 0) {
        internal::LogMessage::LogMessage
                  (&local_90,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/descriptor.cc"
                   ,0xf07);
        pLVar4 = internal::LogMessage::operator<<(&local_90,"\"");
        pLVar4 = internal::LogMessage::operator<<(pLVar4,(string *)parent_local);
        pLVar4 = internal::LogMessage::operator<<
                           (pLVar4,
                            "\" not previously defined in symbols_by_name_, but was defined in symbols_by_parent_; this shouldn\'t be possible."
                           );
        internal::LogFinisher::operator=((LogFinisher *)((long)&other_file + 3),pLVar4);
        internal::LogMessage::~LogMessage(&local_90);
      }
      this_local._7_1_ = false;
    }
  }
  else {
    SVar5 = DescriptorPool::Tables::FindSymbol(this->tables_,(string *)parent_local);
    local_b0 = SVar5.field_1;
    dot_pos._0_4_ = SVar5.type;
    local_a8 = Symbol::GetFile((Symbol *)&dot_pos);
    pvVar2 = parent_local;
    pMVar1 = local_38;
    if (local_a8 == this->file_) {
      local_c0 = std::__cxx11::string::find_last_of((char)parent_local,0x2e);
      pvVar2 = parent_local;
      pMVar1 = local_38;
      if (local_c0 == -1) {
        std::operator+(&local_100,"\"",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       parent_local);
        std::operator+(&local_e0,&local_100,"\" is already defined.");
        AddError(this,(string *)pvVar2,pMVar1,NAME,&local_e0);
        std::__cxx11::string::~string((string *)&local_e0);
        std::__cxx11::string::~string((string *)&local_100);
      }
      else {
        std::__cxx11::string::substr((ulong)&local_1a0,(ulong)parent_local);
        std::operator+(&local_180,"\"",&local_1a0);
        std::operator+(&local_160,&local_180,"\" is already defined in \"");
        std::__cxx11::string::substr((ulong)&local_1c0,(ulong)parent_local);
        std::operator+(&local_140,&local_160,&local_1c0);
        std::operator+(&local_120,&local_140,"\".");
        AddError(this,(string *)pvVar2,pMVar1,NAME,&local_120);
        std::__cxx11::string::~string((string *)&local_120);
        std::__cxx11::string::~string((string *)&local_140);
        std::__cxx11::string::~string((string *)&local_1c0);
        std::__cxx11::string::~string((string *)&local_160);
        std::__cxx11::string::~string((string *)&local_180);
        std::__cxx11::string::~string((string *)&local_1a0);
      }
    }
    else {
      std::operator+(&local_240,"\"",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     parent_local);
      std::operator+(&local_220,&local_240,"\" is already defined in file \"");
      __rhs = FileDescriptor::name_abi_cxx11_(local_a8);
      std::operator+(&local_200,&local_220,__rhs);
      std::operator+(&local_1e0,&local_200,"\".");
      AddError(this,(string *)pvVar2,pMVar1,NAME,&local_1e0);
      std::__cxx11::string::~string((string *)&local_1e0);
      std::__cxx11::string::~string((string *)&local_200);
      std::__cxx11::string::~string((string *)&local_220);
      std::__cxx11::string::~string((string *)&local_240);
    }
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool DescriptorBuilder::AddSymbol(
    const string& full_name, const void* parent, const string& name,
    const Message& proto, Symbol symbol) {
  // If the caller passed NULL for the parent, the symbol is at file scope.
  // Use its file as the parent instead.
  if (parent == NULL) parent = file_;

  if (tables_->AddSymbol(full_name, symbol)) {
    if (!file_tables_->AddAliasUnderParent(parent, name, symbol)) {
      // This is only possible if there was already an error adding something of
      // the same name.
      if (!had_errors_) {
        GOOGLE_LOG(DFATAL) << "\"" << full_name << "\" not previously defined in "
                       "symbols_by_name_, but was defined in "
                       "symbols_by_parent_; this shouldn't be possible.";
      }
      return false;
    }
    return true;
  } else {
    const FileDescriptor* other_file = tables_->FindSymbol(full_name).GetFile();
    if (other_file == file_) {
      string::size_type dot_pos = full_name.find_last_of('.');
      if (dot_pos == string::npos) {
        AddError(full_name, proto, DescriptorPool::ErrorCollector::NAME,
                 "\"" + full_name + "\" is already defined.");
      } else {
        AddError(full_name, proto, DescriptorPool::ErrorCollector::NAME,
                 "\"" + full_name.substr(dot_pos + 1) +
                 "\" is already defined in \"" +
                 full_name.substr(0, dot_pos) + "\".");
      }
    } else {
      // Symbol seems to have been defined in a different file.
      AddError(full_name, proto, DescriptorPool::ErrorCollector::NAME,
               "\"" + full_name + "\" is already defined in file \"" +
               other_file->name() + "\".");
    }
    return false;
  }
}